

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void __thiscall
dlib::cpu::pooling::setup_avg_pooling
          (pooling *this,int window_height_,int window_width_,int stride_y_,int stride_x_,
          int padding_y_,int padding_x_)

{
  uint *puVar1;
  ostream *poVar2;
  fatal_error *pfVar3;
  string local_1b0;
  ostringstream dlib_o_out;
  uint auStack_178 [88];
  
  if (window_width_ < 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x663);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::cpu::pooling::setup_avg_pooling(int, int, int, int, int, int)"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"window_width_ > 0");
    std::operator<<(poVar2,".\n");
    puVar1 = (uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar2,"\n");
    pfVar3 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar3,EBROKEN_ASSERT,&local_1b0);
    __cxa_throw(pfVar3,&fatal_error::typeinfo,error::~error);
  }
  if (window_height_ < 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x664);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::cpu::pooling::setup_avg_pooling(int, int, int, int, int, int)"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"window_height_ > 0");
    std::operator<<(poVar2,".\n");
    puVar1 = (uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar2,"\n");
    pfVar3 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar3,EBROKEN_ASSERT,&local_1b0);
    __cxa_throw(pfVar3,&fatal_error::typeinfo,error::~error);
  }
  if (stride_y_ < 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x665);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::cpu::pooling::setup_avg_pooling(int, int, int, int, int, int)"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"stride_y_ > 0");
    std::operator<<(poVar2,".\n");
    puVar1 = (uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar2,"\n");
    pfVar3 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar3,EBROKEN_ASSERT,&local_1b0);
    __cxa_throw(pfVar3,&fatal_error::typeinfo,error::~error);
  }
  if (0 < stride_x_) {
    if ((uint)window_height_ <= (uint)padding_y_) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
      poVar2 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x667);
      std::operator<<(poVar2,".\n");
      poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                              );
      std::operator<<(poVar2,".\n");
      poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
      poVar2 = std::operator<<(poVar2,
                               "void dlib::cpu::pooling::setup_avg_pooling(int, int, int, int, int, int)"
                              );
      std::operator<<(poVar2,".\n\n");
      poVar2 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
      poVar2 = std::operator<<(poVar2,"0 <= padding_y_ && padding_y_ < window_height_");
      std::operator<<(poVar2,".\n");
      puVar1 = (uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -0x18));
      *puVar1 = *puVar1 | 1;
      poVar2 = std::operator<<((ostream *)&dlib_o_out,"");
      std::operator<<(poVar2,"\n");
      pfVar3 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar3,EBROKEN_ASSERT,&local_1b0);
      __cxa_throw(pfVar3,&fatal_error::typeinfo,error::~error);
    }
    if ((uint)padding_x_ < (uint)window_width_) {
      this->window_height = window_height_;
      this->window_width = window_width_;
      this->stride_y = stride_y_;
      this->stride_x = stride_x_;
      this->padding_y = padding_y_;
      this->padding_x = padding_x_;
      this->do_max_pooling = false;
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x668);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::cpu::pooling::setup_avg_pooling(int, int, int, int, int, int)"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"0 <= padding_x_ && padding_x_ < window_width_");
    std::operator<<(poVar2,".\n");
    puVar1 = (uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar2,"\n");
    pfVar3 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar3,EBROKEN_ASSERT,&local_1b0);
    __cxa_throw(pfVar3,&fatal_error::typeinfo,error::~error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x666);
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                          );
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar2 = std::operator<<(poVar2,
                           "void dlib::cpu::pooling::setup_avg_pooling(int, int, int, int, int, int)"
                          );
  std::operator<<(poVar2,".\n\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar2 = std::operator<<(poVar2,"stride_x_ > 0");
  std::operator<<(poVar2,".\n");
  puVar1 = (uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"");
  std::operator<<(poVar2,"\n");
  pfVar3 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar3,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(pfVar3,&fatal_error::typeinfo,error::~error);
}

Assistant:

void pooling::
        setup_avg_pooling(
            int window_height_,
            int window_width_,
            int stride_y_,
            int stride_x_,
            int padding_y_,
            int padding_x_
        )
        {
            DLIB_CASSERT(window_width_ > 0);
            DLIB_CASSERT(window_height_ > 0);
            DLIB_CASSERT(stride_y_ > 0);
            DLIB_CASSERT(stride_x_ > 0);
            DLIB_CASSERT(0 <= padding_y_ && padding_y_ < window_height_);
            DLIB_CASSERT(0 <= padding_x_ && padding_x_ < window_width_);

            window_height = window_height_;
            window_width = window_width_;
            stride_y = stride_y_;
            stride_x = stride_x_;
            padding_y = padding_y_;
            padding_x = padding_x_;
            do_max_pooling = false;
        }